

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O1

filepos_t __thiscall
libmatroska::KaxInternalBlock::ReadData
          (KaxInternalBlock *this,IOCallback *input,ScopeMode ReadFully)

{
  pointer *pppDVar1;
  LacingType LVar2;
  uint32 uVar3;
  pointer piVar4;
  iterator iVar5;
  KaxInternalBlock *pKVar6;
  undefined1 uVar7;
  byte bVar8;
  ushort uVar9;
  uint16 uVar10;
  int iVar11;
  int iVar12;
  undefined4 extraout_var_00;
  filepos_t fVar13;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined7 extraout_var;
  uint64 uVar14;
  int64 iVar15;
  size_t sVar16;
  DataBuffer *pDVar17;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  EndOfStreamX *pEVar18;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  ulong uVar19;
  vector<int,_std::allocator<int>_> *pvVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  byte bVar24;
  ushort *puVar25;
  vector<int,_std::allocator<int>_> *this_00;
  uint uVar26;
  ulong uVar27;
  size_type sVar28;
  binary *pbVar29;
  binary *pbVar30;
  binary *pbVar31;
  uint32 SizeRead;
  uint64 SizeUnknown;
  DataBuffer *lacedFrame;
  SafeReadIOCallback Mem;
  uint local_8c;
  KaxInternalBlock *local_88;
  vector<int,_std::allocator<int>_> *local_80;
  undefined8 local_78;
  binary *local_70;
  DataBuffer *local_68;
  SafeReadIOCallback local_60;
  binary *local_48;
  vector<libmatroska::DataBuffer*,std::allocator<libmatroska::DataBuffer*>> *local_40;
  filepos_t local_38;
  
  iVar11 = (*input->_vptr_IOCallback[5])(input);
  this->FirstFrameLocation = CONCAT44(extraout_var_00,iVar11);
  (this->super_EbmlBinary).super_EbmlElement.bValueIsSet = false;
  local_88 = this;
  if (ReadFully == SCOPE_PARTIAL_DATA) {
    iVar11 = (*input->_vptr_IOCallback[2])(input,&local_78,5);
    if (iVar11 != 5) {
      pEVar18 = (EndOfStreamX *)__cxa_allocate_exception(8);
      libebml::SafeReadIOCallback::EndOfStreamX::EndOfStreamX(pEVar18,0);
      __cxa_throw(pEVar18,&libebml::SafeReadIOCallback::EndOfStreamX::typeinfo,0);
    }
    bVar8 = (byte)local_78;
    this->TrackNumber = (ushort)(byte)local_78;
    if ((char)(byte)local_78 < '\0') {
      puVar25 = (ushort *)((long)&local_78 + 1);
      uVar9 = (byte)local_78 & 0x7f;
      lVar22 = 4;
    }
    else {
      if ((byte)local_78 < 0x40) {
        return 5;
      }
      puVar25 = (ushort *)((long)&local_78 + 2);
      uVar9 = ((byte)local_78 & 0x3f) << 8;
      this->TrackNumber = uVar9;
      uVar9 = local_78._1_1_ | uVar9;
      lVar22 = 5;
    }
    this->TrackNumber = uVar9;
    this->LocalTimecode = *puVar25 << 8 | *puVar25 >> 8;
    this->bLocalTimecodeUsed = true;
    iVar11 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[3])(this);
    if ((*(long *)(KaxSimpleBlock::ClassInfos._8_8_ + 8) ==
         *(long *)((int *)CONCAT44(extraout_var_03,iVar11) + 2)) &&
       (*(int *)KaxSimpleBlock::ClassInfos._8_8_ == *(int *)CONCAT44(extraout_var_03,iVar11))) {
      uVar9 = puVar25[1];
      this->bIsKeyframe = (bool)((byte)uVar9 >> 7);
      this->bIsDiscardable = (bool)((byte)uVar9 & 1);
    }
    uVar9 = puVar25[1];
    this->mInvisible = (bool)((byte)uVar9 >> 3 & 1);
    this->mLacing = (byte)((byte)uVar9 >> 1) & LACING_EBML;
    if ((char)bVar8 < '\0') {
      uVar7 = local_78._4_1_;
      local_78 = (DataBuffer *)CONCAT71(local_78._1_7_,uVar7);
    }
    else {
      (*input->_vptr_IOCallback[2])(input,&local_78,1);
    }
    this->FirstFrameLocation = this->FirstFrameLocation + lVar22;
    if (this->mLacing == LACING_NONE) {
      std::vector<int,_std::allocator<int>_>::resize(&this->SizeList,1);
      iVar11 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
      *(this->SizeList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start = iVar11 - (uint)lVar22;
    }
    else {
      iVar11 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
      bVar8 = (byte)local_78;
      pbVar31 = (binary *)((ulong)local_78 & 0xff);
      this_00 = &this->SizeList;
      local_70 = (binary *)((long)pbVar31 + 1);
      std::vector<int,_std::allocator<int>_>::resize(this_00,(size_type)local_70);
      uVar26 = iVar11 + ~(uint)lVar22;
      uVar19 = (ulong)uVar26;
      LVar2 = this->mLacing;
      if (LVar2 == LACING_XIPH) {
        if (bVar8 == 0) {
          uVar27 = 0;
        }
        else {
          local_70 = (binary *)(ulong)(uint)bVar8;
          uVar27 = 0;
          local_80 = this_00;
          do {
            iVar11 = 0;
            do {
              iVar12 = iVar11;
              (*input->_vptr_IOCallback[2])(input,&local_78,1);
              iVar11 = iVar12 + (uint)(byte)local_78;
              uVar26 = (int)uVar19 - 1;
              uVar19 = (ulong)uVar26;
              uVar14 = this->FirstFrameLocation;
              this->FirstFrameLocation = uVar14 + 1;
            } while ((byte)local_78 == 0xff);
            this->FirstFrameLocation = uVar14 + 2;
            (this->SizeList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar27] = iVar11;
            uVar19 = (ulong)(uVar26 - iVar11);
            uVar27 = uVar27 + 1;
          } while ((binary *)uVar27 != local_70);
          uVar27 = uVar27 & 0xff;
          uVar26 = uVar26 - (iVar12 + (uint)(byte)local_78);
          this_00 = local_80;
        }
        (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[uVar27] = uVar26;
      }
      else if (LVar2 == LACING_EBML) {
        local_68 = (DataBuffer *)CONCAT44(local_68._4_4_,uVar26);
        local_80 = (vector<int,_std::allocator<int>_> *)uVar19;
        local_48 = (binary *)operator_new__((ulong)((uint)bVar8 * 4));
        (*input->_vptr_IOCallback[2])(input,local_48,(ulong)((uint)bVar8 * 4));
        uVar14 = libebml::ReadCodedSizeValue(local_48,(uint32 *)&local_68,(uint64 *)&local_60);
        *(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_start = (int)uVar14;
        pbVar30 = local_48 + ((ulong)local_68 & 0xffffffff);
        uVar26 = (int)local_80 - ((int)local_68 + (int)uVar14);
        pvVar20 = (vector<int,_std::allocator<int>_> *)(ulong)uVar26;
        sVar28 = 1;
        local_80 = pvVar20;
        if (1 < bVar8) {
          do {
            local_70 = pbVar31;
            local_68 = (DataBuffer *)CONCAT44(local_68._4_4_,(int)pvVar20);
            iVar15 = libebml::ReadCodedSizeSignedValue
                               (pbVar30,(uint32 *)&local_68,(uint64 *)&local_60);
            uVar14 = iVar15 + (int)uVar14;
            (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start[sVar28] = (int)uVar14;
            pbVar30 = pbVar30 + ((ulong)local_68 & 0xffffffff);
            uVar26 = (int)pvVar20 - ((int)local_68 + (int)uVar14);
            pvVar20 = (vector<int,_std::allocator<int>_> *)(ulong)uVar26;
            sVar28 = sVar28 + 1;
            pbVar31 = local_70;
          } while (local_70 != (binary *)sVar28);
        }
        this->FirstFrameLocation = (uint64)(pbVar30 + (this->FirstFrameLocation - (long)local_48));
        (this->SizeList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[sVar28] = uVar26;
        operator_delete__(local_48);
      }
      else {
        if (LVar2 != LACING_FIXED) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                        ,0x2b2,
                        "virtual filepos_t libmatroska::KaxInternalBlock::ReadData(IOCallback &, ScopeMode)"
                       );
        }
        uVar19 = 0;
        piVar4 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        bVar24 = 1;
        if (1 < (byte)(bVar8 + 1)) {
          bVar24 = bVar8 + 1;
        }
        do {
          piVar4[uVar19] = uVar26 / (uint)local_70;
          uVar19 = uVar19 + 1;
        } while (bVar24 != uVar19);
      }
    }
    (this->super_EbmlBinary).super_EbmlElement.bValueIsSet = false;
    iVar11 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
    return CONCAT44(extraout_var_09,iVar11);
  }
  if (ReadFully != SCOPE_ALL_DATA) {
    (this->super_EbmlBinary).super_EbmlElement.bValueIsSet = false;
    iVar11 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
    return CONCAT44(extraout_var_02,iVar11);
  }
  fVar13 = libebml::EbmlBinary::ReadData(&this->super_EbmlBinary,input,SCOPE_ALL_DATA);
  iVar11 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
  if (fVar13 != CONCAT44(extraout_var_01,iVar11)) {
    pEVar18 = (EndOfStreamX *)__cxa_allocate_exception(8);
    iVar11 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
    libebml::SafeReadIOCallback::EndOfStreamX::EndOfStreamX
              (pEVar18,CONCAT44(extraout_var_10,iVar11) - fVar13);
    __cxa_throw(pEVar18,&libebml::SafeReadIOCallback::EndOfStreamX::typeinfo,0);
  }
  local_70 = (this->super_EbmlBinary).Data;
  libebml::SafeReadIOCallback::SafeReadIOCallback(&local_60,&this->super_EbmlBinary);
  bVar8 = libebml::SafeReadIOCallback::GetUInt8(&local_60);
  this->TrackNumber = (ushort)bVar8;
  if ((char)bVar8 < '\0') {
    uVar9 = (ushort)(bVar8 & 0x7f);
    uVar26 = 4;
  }
  else {
    if (bVar8 < 0x40) {
      pEVar18 = (EndOfStreamX *)__cxa_allocate_exception(8);
      libebml::SafeReadIOCallback::EndOfStreamX::EndOfStreamX(pEVar18,0);
      __cxa_throw(pEVar18,&libebml::SafeReadIOCallback::EndOfStreamX::typeinfo,0);
    }
    this->TrackNumber = (ushort)(bVar8 & 0x3f) << 8;
    bVar8 = libebml::SafeReadIOCallback::GetUInt8(&local_60);
    uVar9 = (ushort)bVar8 + this->TrackNumber;
    uVar26 = 5;
  }
  this->TrackNumber = uVar9;
  uVar10 = libebml::SafeReadIOCallback::GetUInt16BE(&local_60);
  this->LocalTimecode = uVar10;
  this->bLocalTimecodeUsed = true;
  bVar8 = libebml::SafeReadIOCallback::GetUInt8(&local_60);
  iVar11 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[3])(this);
  if ((*(long *)(KaxSimpleBlock::ClassInfos._8_8_ + 8) ==
       *(long *)((int *)CONCAT44(extraout_var_04,iVar11) + 2)) &&
     (*(int *)KaxSimpleBlock::ClassInfos._8_8_ == *(int *)CONCAT44(extraout_var_04,iVar11))) {
    this->bIsKeyframe = (bool)(bVar8 >> 7);
    this->bIsDiscardable = (bool)(bVar8 & 1);
  }
  this->mInvisible = (bool)(bVar8 >> 3 & 1);
  bVar8 = bVar8 >> 1 & 3;
  this->mLacing = (uint)bVar8;
  local_38 = fVar13;
  if (bVar8 == 0) {
    sVar16 = libebml::SafeReadIOCallback::GetPosition(&local_60);
    this->FirstFrameLocation = this->FirstFrameLocation + sVar16;
    pDVar17 = (DataBuffer *)operator_new(0x28);
    sVar16 = libebml::SafeReadIOCallback::GetPosition(&local_60);
    iVar11 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
    pDVar17->_vptr_DataBuffer = (_func_int **)&PTR__DataBuffer_001ce5b0;
    pDVar17->mySize = iVar11 - uVar26;
    pDVar17->bValidValue = true;
    pDVar17->myFreeBuffer = (_func_bool_DataBuffer_ptr *)0x0;
    pDVar17->bInternalBuffer = false;
    pDVar17->myBuffer = local_70 + sVar16;
    iVar5._M_current =
         (this->myBuffers).
         super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_78 = pDVar17;
    if (iVar5._M_current ==
        (this->myBuffers).
        super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<libmatroska::DataBuffer*,std::allocator<libmatroska::DataBuffer*>>::
      _M_realloc_insert<libmatroska::DataBuffer*const&>
                ((vector<libmatroska::DataBuffer*,std::allocator<libmatroska::DataBuffer*>> *)
                 &this->myBuffers,iVar5,(DataBuffer **)&local_78);
    }
    else {
      *iVar5._M_current = pDVar17;
      pppDVar1 = &(this->myBuffers).
                  super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppDVar1 = *pppDVar1 + 1;
    }
    std::vector<int,_std::allocator<int>_>::resize(&this->SizeList,1);
    iVar11 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
    *(this->SizeList).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_start = iVar11 - uVar26;
    goto LAB_0018b501;
  }
  iVar11 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
  bVar8 = libebml::SafeReadIOCallback::GetUInt8(&local_60);
  pbVar31 = (binary *)(CONCAT71(extraout_var,bVar8) & 0xffffffff);
  local_80 = &this->SizeList;
  local_40 = (vector<libmatroska::DataBuffer*,std::allocator<libmatroska::DataBuffer*>> *)
             (ulong)bVar8;
  std::vector<int,_std::allocator<int>_>::resize(local_80,(ulong)(bVar8 + 1));
  uVar26 = iVar11 + ~uVar26;
  LVar2 = this->mLacing;
  bVar24 = (byte)pbVar31;
  local_48 = pbVar31;
  if (LVar2 == LACING_XIPH) {
    if (bVar24 == 0) {
      uVar19 = 0;
    }
    else {
      uVar19 = 0;
      do {
        iVar11 = 0;
        uVar21 = uVar26;
        do {
          iVar12 = iVar11;
          bVar8 = libebml::SafeReadIOCallback::GetUInt8(&local_60);
          iVar11 = iVar12 + (uint)bVar8;
          uVar21 = uVar21 - 1;
        } while (bVar8 == 0xff);
        (local_80->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[uVar19] = iVar11;
        uVar26 = uVar21 - iVar11;
        uVar19 = uVar19 + 1;
      } while ((vector<libmatroska::DataBuffer*,std::allocator<libmatroska::DataBuffer*>> *)uVar19
               != local_40);
      uVar19 = uVar19 & 0xff;
      uVar26 = uVar21 - (iVar12 + (uint)bVar8);
    }
LAB_0018b43d:
    (local_80->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_start[uVar19] = uVar26;
  }
  else if (LVar2 == LACING_EBML) {
    local_8c = uVar26;
    sVar16 = libebml::SafeReadIOCallback::GetPosition(&local_60);
    uVar14 = libebml::ReadCodedSizeValue(local_70 + sVar16,&local_8c,&local_78);
    iVar11 = (int)uVar14;
    if ((iVar11 == 0) || (uVar26 < local_8c + iVar11)) {
      pEVar18 = (EndOfStreamX *)__cxa_allocate_exception(8);
      libebml::SafeReadIOCallback::EndOfStreamX::EndOfStreamX(pEVar18,(ulong)local_8c);
LAB_0018b645:
      __cxa_throw(pEVar18,&libebml::SafeReadIOCallback::EndOfStreamX::typeinfo,0);
    }
    *(local_80->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
     _M_start = iVar11;
    libebml::SafeReadIOCallback::Skip(&local_60,(ulong)local_8c);
    uVar26 = uVar26 - (local_8c + iVar11);
    uVar19 = 1;
    if (1 < bVar24) {
      uVar19 = 1;
      do {
        local_8c = uVar26;
        sVar16 = libebml::SafeReadIOCallback::GetPosition(&local_60);
        iVar15 = libebml::ReadCodedSizeSignedValue(local_70 + sVar16,&local_8c,&local_78);
        uVar14 = iVar15 + (int)uVar14;
        iVar11 = (int)uVar14;
        if ((iVar11 == 0) || (uVar26 < local_8c + iVar11)) {
          pEVar18 = (EndOfStreamX *)__cxa_allocate_exception(8);
          libebml::SafeReadIOCallback::EndOfStreamX::EndOfStreamX(pEVar18,(ulong)local_8c);
          goto LAB_0018b645;
        }
        (local_80->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[uVar19] = iVar11;
        libebml::SafeReadIOCallback::Skip(&local_60,(ulong)local_8c);
        uVar26 = uVar26 - (local_8c + iVar11);
        uVar19 = uVar19 + 1;
      } while (local_40 !=
               (vector<libmatroska::DataBuffer*,std::allocator<libmatroska::DataBuffer*>> *)uVar19);
    }
    if ((byte)uVar19 <= bVar24) {
      uVar19 = uVar19 & 0xff;
      goto LAB_0018b43d;
    }
  }
  else {
    if (LVar2 != LACING_FIXED) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                    ,0x22e,
                    "virtual filepos_t libmatroska::KaxInternalBlock::ReadData(IOCallback &, ScopeMode)"
                   );
    }
    uVar19 = 0;
    piVar4 = (local_80->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar23 = (int)CONCAT71(extraout_var,bVar8) + 1;
    uVar21 = 1;
    if (1 < (byte)uVar23) {
      uVar21 = uVar23 & 0xff;
    }
    do {
      piVar4[uVar19] = uVar26 / (bVar8 + 1);
      uVar19 = uVar19 + 1;
    } while (uVar21 != uVar19);
  }
  sVar16 = libebml::SafeReadIOCallback::GetPosition(&local_60);
  this->FirstFrameLocation = this->FirstFrameLocation + sVar16;
  local_40 = (vector<libmatroska::DataBuffer*,std::allocator<libmatroska::DataBuffer*>> *)
             &this->myBuffers;
  bVar8 = 0;
  do {
    pDVar17 = (DataBuffer *)operator_new(0x28);
    sVar16 = libebml::SafeReadIOCallback::GetPosition(&local_60);
    uVar3 = (this->SizeList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[bVar8];
    pDVar17->_vptr_DataBuffer = (_func_int **)&PTR__DataBuffer_001ce5b0;
    pDVar17->mySize = uVar3;
    pDVar17->bValidValue = true;
    pDVar17->myFreeBuffer = (_func_bool_DataBuffer_ptr *)0x0;
    pDVar17->bInternalBuffer = false;
    pDVar17->myBuffer = local_70 + sVar16;
    iVar5._M_current =
         (this->myBuffers).
         super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_68 = pDVar17;
    if (iVar5._M_current ==
        (this->myBuffers).
        super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<libmatroska::DataBuffer*,std::allocator<libmatroska::DataBuffer*>>::
      _M_realloc_insert<libmatroska::DataBuffer*const&>(local_40,iVar5,&local_68);
    }
    else {
      *iVar5._M_current = pDVar17;
      pppDVar1 = &(this->myBuffers).
                  super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppDVar1 = *pppDVar1 + 1;
    }
    libebml::SafeReadIOCallback::Skip
              (&local_60,
               (long)(local_80->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[bVar8]);
    bVar8 = bVar8 + 1;
  } while (bVar8 <= (byte)local_48);
LAB_0018b501:
  iVar11 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
  pbVar31 = local_70 + CONCAT44(extraout_var_05,iVar11);
  uVar27 = (long)(this->myBuffers).
                 super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->myBuffers).
                 super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3;
  uVar19 = 1;
  do {
    pKVar6 = local_88;
    if (uVar19 - uVar27 == 1) {
      (local_88->super_EbmlBinary).super_EbmlElement.bValueIsSet = true;
      libebml::SafeReadIOCallback::~SafeReadIOCallback(&local_60);
      return local_38;
    }
    iVar11 = (*(local_88->myBuffers).
               super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar19 - 1]->_vptr_DataBuffer[2])();
    iVar12 = (*(pKVar6->myBuffers).
               super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar19 - 1]->_vptr_DataBuffer[3])();
    uVar26 = *(uint *)CONCAT44(extraout_var_07,iVar12);
    pbVar30 = pbVar31;
    if (uVar19 < uVar27) {
      iVar12 = (*(local_88->myBuffers).
                 super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar19]->_vptr_DataBuffer[2])();
      pbVar30 = (binary *)CONCAT44(extraout_var_08,iVar12);
    }
  } while (((local_70 <= (binary *)CONCAT44(extraout_var_06,iVar11)) &&
           (pbVar29 = (binary *)CONCAT44(extraout_var_06,iVar11) + uVar26, pbVar29 <= pbVar31)) &&
          (uVar19 = uVar19 + 1, pbVar29 == pbVar30));
  pEVar18 = (EndOfStreamX *)__cxa_allocate_exception(8);
  libebml::SafeReadIOCallback::EndOfStreamX::EndOfStreamX(pEVar18,0);
  __cxa_throw(pEVar18,&libebml::SafeReadIOCallback::EndOfStreamX::typeinfo,0);
}

Assistant:

filepos_t KaxInternalBlock::ReadData(IOCallback & input, ScopeMode ReadFully)
{
  filepos_t Result;

  FirstFrameLocation = input.getFilePointer(); // will be updated accordingly below

  SetValueIsSet(false);

  try {
    if (ReadFully == SCOPE_ALL_DATA) {
      Result = EbmlBinary::ReadData(input, ReadFully);
      if (Result != GetSize())
        throw SafeReadIOCallback::EndOfStreamX(GetSize() - Result);

      binary *BufferStart = EbmlBinary::GetBuffer();

      SafeReadIOCallback Mem(*this);
      uint8 BlockHeadSize = 4;

      // update internal values
      TrackNumber = Mem.GetUInt8();
      if ((TrackNumber & 0x80) == 0) {
        // there is extra data
        if ((TrackNumber & 0x40) == 0) {
          // We don't support track numbers that large !
          throw SafeReadIOCallback::EndOfStreamX(0);
        }
        TrackNumber = (TrackNumber & 0x3F) << 8;
        TrackNumber += Mem.GetUInt8();
        BlockHeadSize++;
      } else {
        TrackNumber &= 0x7F;
      }

      LocalTimecode = int16(Mem.GetUInt16BE());
      bLocalTimecodeUsed = true;

      uint8 Flags = Mem.GetUInt8();
      if (EbmlId(*this) == EBML_ID(KaxSimpleBlock)) {
        bIsKeyframe = (Flags & 0x80) != 0;
        bIsDiscardable = (Flags & 0x01) != 0;
      }
      mInvisible = (Flags & 0x08) >> 3;
      mLacing = LacingType((Flags & 0x06) >> 1);

      // put all Frames in the list
      if (mLacing == LACING_NONE) {
        FirstFrameLocation += Mem.GetPosition();
        DataBuffer * soloFrame = new DataBuffer(BufferStart + Mem.GetPosition(), GetSize() - BlockHeadSize);
        myBuffers.push_back(soloFrame);
        SizeList.resize(1);
        SizeList[0] = GetSize() - BlockHeadSize;
      } else {
        // read the number of frames in the lace
        uint32 LastBufferSize = GetSize() - BlockHeadSize - 1; // 1 for number of frame
        uint8 FrameNum = Mem.GetUInt8(); // number of frames in the lace - 1
        // read the list of frame sizes
        uint8 Index;
        int32 FrameSize;
        uint32 SizeRead;
        uint64 SizeUnknown;

        SizeList.resize(FrameNum + 1);

        switch (mLacing) {
          case LACING_XIPH:
            for (Index=0; Index<FrameNum; Index++) {
              // get the size of the frame
              FrameSize = 0;
              uint8 Value;
              do {
                Value = Mem.GetUInt8();
                FrameSize += Value;
                LastBufferSize--;
              } while (Value == 0xFF);
              SizeList[Index] = FrameSize;
              LastBufferSize -= FrameSize;
            }
            SizeList[Index] = LastBufferSize;
            break;
          case LACING_EBML:
            SizeRead = LastBufferSize;
            FrameSize = ReadCodedSizeValue(BufferStart + Mem.GetPosition(), SizeRead, SizeUnknown);
            if (!FrameSize || (static_cast<uint32>(FrameSize + SizeRead) > LastBufferSize))
              throw SafeReadIOCallback::EndOfStreamX(SizeRead);
            SizeList[0] = FrameSize;
            Mem.Skip(SizeRead);
            LastBufferSize -= FrameSize + SizeRead;

            for (Index=1; Index<FrameNum; Index++) {
              // get the size of the frame
              SizeRead = LastBufferSize;
              FrameSize += ReadCodedSizeSignedValue(BufferStart + Mem.GetPosition(), SizeRead, SizeUnknown);
              if (!FrameSize || (static_cast<uint32>(FrameSize + SizeRead) > LastBufferSize))
                throw SafeReadIOCallback::EndOfStreamX(SizeRead);
              SizeList[Index] = FrameSize;
              Mem.Skip(SizeRead);
              LastBufferSize -= FrameSize + SizeRead;
            }
            if (Index <= FrameNum) // Safety check if FrameNum == 0
              SizeList[Index] = LastBufferSize;
            break;
          case LACING_FIXED:
            for (Index=0; Index<=FrameNum; Index++) {
              // get the size of the frame
              SizeList[Index] = LastBufferSize / (FrameNum + 1);
            }
            break;
          default: // other lacing not supported
            assert(0);
        }

        FirstFrameLocation += Mem.GetPosition();

        for (Index=0; Index<=FrameNum; Index++) {
          DataBuffer * lacedFrame = new DataBuffer(BufferStart + Mem.GetPosition(), SizeList[Index]);
          myBuffers.push_back(lacedFrame);
          Mem.Skip(SizeList[Index]);
        }
      }

      binary *BufferEnd = BufferStart + GetSize();
      size_t NumFrames  = myBuffers.size();

      // Sanity checks for frame pointers and boundaries.
      for (size_t Index = 0; Index < NumFrames; ++Index) {
        binary *FrameStart  = myBuffers[Index]->Buffer();
        binary *FrameEnd    = FrameStart + myBuffers[Index]->Size();
        binary *ExpectedEnd = (Index + 1) < NumFrames ? myBuffers[Index + 1]->Buffer() : BufferEnd;

        if ((FrameStart < BufferStart) || (FrameEnd > BufferEnd) || (FrameEnd != ExpectedEnd))
          throw SafeReadIOCallback::EndOfStreamX(0);
      }

      SetValueIsSet();
    } else if (ReadFully == SCOPE_PARTIAL_DATA) {
      binary _TempHead[5];
      Result = input.read(_TempHead, 5);
      if (Result != 5)
        throw SafeReadIOCallback::EndOfStreamX(0);
      binary *cursor = _TempHead;
      binary *_tmpBuf;
      uint8 BlockHeadSize = 4;

      // update internal values
      TrackNumber = *cursor++;
      if ((TrackNumber & 0x80) == 0) {
        // there is extra data
        if ((TrackNumber & 0x40) == 0) {
          // We don't support track numbers that large !
          return Result;
        }
        TrackNumber = (TrackNumber & 0x3F) << 8;
        TrackNumber += *cursor++;
        BlockHeadSize++;
      } else {
        TrackNumber &= 0x7F;
      }

      big_int16 b16;
      b16.Eval(cursor);
      LocalTimecode = int16(b16);
      bLocalTimecodeUsed = true;
      cursor += 2;

      if (EbmlId(*this) == EBML_ID(KaxSimpleBlock)) {
        bIsKeyframe = (*cursor & 0x80) != 0;
        bIsDiscardable = (*cursor & 0x01) != 0;
      }
      mInvisible = (*cursor & 0x08) >> 3;
      mLacing = LacingType((*cursor++ & 0x06) >> 1);
      if (cursor == &_TempHead[4]) {
        _TempHead[0] = _TempHead[4];
      } else {
        Result += input.read(_TempHead, 1);
      }

      FirstFrameLocation += cursor - _TempHead;

      // put all Frames in the list
      if (mLacing != LACING_NONE) {
        // read the number of frames in the lace
        uint32 LastBufferSize = GetSize() - BlockHeadSize - 1; // 1 for number of frame
        uint8 FrameNum = _TempHead[0]; // number of frames in the lace - 1
        // read the list of frame sizes
        uint8 Index;
        int32 FrameSize;
        uint32 SizeRead;
        uint64 SizeUnknown;

        SizeList.resize(FrameNum + 1);

        switch (mLacing) {
          case LACING_XIPH:
            for (Index=0; Index<FrameNum; Index++) {
              // get the size of the frame
              FrameSize = 0;
              do {
                Result += input.read(_TempHead, 1);
                FrameSize += uint8(_TempHead[0]);
                LastBufferSize--;

                FirstFrameLocation++;
              } while (_TempHead[0] == 0xFF);

              FirstFrameLocation++;
              SizeList[Index] = FrameSize;
              LastBufferSize -= FrameSize;
            }
            SizeList[Index] = LastBufferSize;
            break;
          case LACING_EBML:
            SizeRead = LastBufferSize;
            cursor = _tmpBuf = new binary[FrameNum*4]; /// \warning assume the mean size will be coded in less than 4 bytes
            Result += input.read(cursor, FrameNum*4);
            FrameSize = ReadCodedSizeValue(cursor, SizeRead, SizeUnknown);
            SizeList[0] = FrameSize;
            cursor += SizeRead;
            LastBufferSize -= FrameSize + SizeRead;

            for (Index=1; Index<FrameNum; Index++) {
              // get the size of the frame
              SizeRead = LastBufferSize;
              FrameSize += ReadCodedSizeSignedValue(cursor, SizeRead, SizeUnknown);
              SizeList[Index] = FrameSize;
              cursor += SizeRead;
              LastBufferSize -= FrameSize + SizeRead;
            }

            FirstFrameLocation += cursor - _tmpBuf;

            SizeList[Index] = LastBufferSize;
            delete [] _tmpBuf;
            break;
          case LACING_FIXED:
            for (Index=0; Index<=FrameNum; Index++) {
              // get the size of the frame
              SizeList[Index] = LastBufferSize / (FrameNum + 1);
            }
            break;
          default: // other lacing not supported
            assert(0);
        }
      } else {
        SizeList.resize(1);
        SizeList[0] = GetSize() - BlockHeadSize;
      }
      SetValueIsSet(false);
      Result = GetSize();
    } else {
      SetValueIsSet(false);
      Result = GetSize();
    }

  } catch (SafeReadIOCallback::EndOfStreamX &) {
    SetValueIsSet(false);

    std::memset(EbmlBinary::GetBuffer(), 0, GetSize());
    myBuffers.clear();
    SizeList.clear();
    Timecode           = 0;
    LocalTimecode      = 0;
    TrackNumber        = 0;
    bLocalTimecodeUsed = false;
    FirstFrameLocation = 0;

    return 0;
  }

  return Result;
}